

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::reorderPatternsByPartition
          (BeagleCPUImpl<float,_1,_0> *this)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  long in_RDI;
  int pIndex_1;
  int sortIndex_1;
  int i_6;
  int *unsortedTips;
  int pIndex;
  int sortIndex;
  int j_2;
  int i_5;
  int l;
  float *unsortedPartials;
  int tip;
  int *sortedTips;
  float *sortedPartials;
  int j_1;
  int i_4;
  int currentPattern;
  int i_3;
  int j;
  int i_2;
  int i_1;
  int i;
  double *sortedPatternWeights;
  int *partitionSizes;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar4;
  BeagleCPUImpl<float,_1,_0> *in_stack_ffffffffffffff80;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_4;
  
  if ((*(byte *)(in_RDI + 0x51) & 1) == 0) {
    pvVar1 = malloc((long)*(int *)(in_RDI + 0x14) << 2);
    *(void **)(in_RDI + 0x90) = pvVar1;
    pvVar1 = malloc((long)*(int *)(in_RDI + 0x48) << 2);
    pvVar2 = malloc((long)*(int *)(in_RDI + 0x14) << 3);
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x48); local_24 = local_24 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x88) + (long)local_24 * 4) = 0;
      *(undefined4 *)((long)pvVar1 + (long)local_24 * 4) = 0;
    }
    for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x14); local_28 = local_28 + 1) {
      lVar3 = (long)*(int *)(*(long *)(in_RDI + 0x80) + (long)local_28 * 4);
      iVar4 = *(int *)((long)pvVar1 + lVar3 * 4);
      *(int *)((long)pvVar1 + lVar3 * 4) = iVar4 + 1;
      *(int *)(*(long *)(in_RDI + 0x90) + (long)local_28 * 4) = iVar4;
    }
    for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x48); local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
        *(int *)(*(long *)(in_RDI + 0x88) + (long)local_2c * 4) =
             *(int *)((long)pvVar1 + (long)local_30 * 4) +
             *(int *)(*(long *)(in_RDI + 0x88) + (long)local_2c * 4);
      }
    }
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + (long)*(int *)(in_RDI + 0x48) * 4) =
         *(undefined4 *)(in_RDI + 0x14);
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x14); local_34 = local_34 + 1) {
      *(int *)(*(long *)(in_RDI + 0x90) + (long)local_34 * 4) =
           *(int *)(*(long *)(in_RDI + 0x88) +
                   (long)*(int *)(*(long *)(in_RDI + 0x80) + (long)local_34 * 4) * 4) +
           *(int *)(*(long *)(in_RDI + 0x90) + (long)local_34 * 4);
      *(undefined8 *)
       ((long)pvVar2 + (long)*(int *)(*(long *)(in_RDI + 0x90) + (long)local_34 * 4) * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x78) + (long)local_34 * 8);
    }
    local_38 = 0;
    for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x48); local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < *(int *)((long)pvVar1 + (long)local_3c * 4);
          local_40 = local_40 + 1) {
        *(int *)(*(long *)(in_RDI + 0x80) + (long)local_38 * 4) = local_3c;
        local_38 = local_38 + 1;
      }
    }
    free(pvVar1);
    free(*(void **)(in_RDI + 0x78));
    *(void **)(in_RDI + 0x78) = pvVar2;
    local_48 = mallocAligned(in_stack_ffffffffffffff80,
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_50 = mallocAligned(in_stack_ffffffffffffff80,
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x10); local_54 = local_54 + 1) {
      if (*(long *)(*(long *)(in_RDI + 0xb0) + (long)local_54 * 8) == 0) {
        pvVar1 = *(void **)(*(long *)(in_RDI + 0xa8) + (long)local_54 * 8);
        for (local_64 = 0; local_64 < *(int *)(in_RDI + 0x34); local_64 = local_64 + 1) {
          for (local_68 = 0; local_68 < *(int *)(in_RDI + 0x14); local_68 = local_68 + 1) {
            for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x24); local_6c = local_6c + 1) {
              *(undefined4 *)
               ((long)local_48 +
               (long)(local_64 * *(int *)(in_RDI + 0x24) * *(int *)(in_RDI + 0x14) +
                      *(int *)(*(long *)(in_RDI + 0x90) + (long)local_68 * 4) *
                      *(int *)(in_RDI + 0x24) + local_6c) * 4) =
                   *(undefined4 *)
                    ((long)pvVar1 +
                    (long)(local_64 * *(int *)(in_RDI + 0x24) * *(int *)(in_RDI + 0x14) +
                           local_68 * *(int *)(in_RDI + 0x24) + local_6c) * 4);
            }
          }
        }
        *(void **)(*(long *)(in_RDI + 0xa8) + (long)local_54 * 8) = local_48;
        local_48 = pvVar1;
      }
      else {
        pvVar1 = *(void **)(*(long *)(in_RDI + 0xb0) + (long)local_54 * 8);
        for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 0x14); iVar4 = iVar4 + 1) {
          *(undefined4 *)
           ((long)local_50 + (long)*(int *)(*(long *)(in_RDI + 0x90) + (long)iVar4 * 4) * 4) =
               *(undefined4 *)((long)pvVar1 + (long)iVar4 * 4);
        }
        *(void **)(*(long *)(in_RDI + 0xb0) + (long)local_54 * 8) = local_50;
        local_50 = pvVar1;
      }
    }
    free(local_48);
    free(local_50);
    *(undefined1 *)(in_RDI + 0x51) = 1;
    local_4 = 0;
  }
  else {
    local_4 = -7;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::reorderPatternsByPartition() {

    if (!kPatternsReordered) {
        gPatternsNewOrder = (int*) malloc(kPatternCount * sizeof(int));
    } else {
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
    }

    int* partitionSizes = (int*) malloc(kPartitionCount * sizeof(int));
    double* sortedPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);

    for (int i=0; i < kPartitionCount; i++) {
        gPatternPartitionsStartPatterns[i] = 0;
        partitionSizes[i] = 0;
    }

    for (int i=0; i < kPatternCount; i++) {
         gPatternsNewOrder[i] = partitionSizes[gPatternPartitions[i]]++;
    }

    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < i; j++) {
            gPatternPartitionsStartPatterns[i] += partitionSizes[j];
        }
    }
    gPatternPartitionsStartPatterns[kPartitionCount] = kPatternCount;

    for (int i=0; i < kPatternCount; i++) {
        gPatternsNewOrder[i] += gPatternPartitionsStartPatterns[gPatternPartitions[i]];
        sortedPatternWeights[gPatternsNewOrder[i]] = gPatternWeights[i];
    }


    int currentPattern = 0;
    for (int i=0; i < kPartitionCount; i++) {
        for (int j=0; j < partitionSizes[i]; j++) {
            gPatternPartitions[currentPattern++] = i;
        }
    }

    free(partitionSizes);
    free(gPatternWeights);
    gPatternWeights = sortedPatternWeights;

    REALTYPE* sortedPartials = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
    int* sortedTips = (int*) mallocAligned(sizeof(int) * kPaddedPatternCount);

    for (int tip=0; tip < kTipCount; tip++) {
        if (gTipStates[tip] == NULL) {
            REALTYPE* unsortedPartials = gPartials[tip];
            for (int l=0; l < kCategoryCount; l++) {
                for (int i=0; i < kPatternCount; i++) {
                    for (int j=0; j < kStateCount; j++) {
                        int sortIndex = l*kStateCount*kPatternCount + gPatternsNewOrder[i]*kStateCount + j;
                        int pIndex = l*kStateCount*kPatternCount + i*kStateCount + j;
                        sortedPartials[sortIndex] = unsortedPartials[pIndex];
                    }
                }
            }
            gPartials[tip] = sortedPartials;
            sortedPartials = unsortedPartials;
        } else {
            int* unsortedTips = gTipStates[tip];
            for (int i=0; i < kPatternCount; i++) {
                int sortIndex = gPatternsNewOrder[i];
                int pIndex = i;
                sortedTips[sortIndex] = unsortedTips[pIndex];
            }
            gTipStates[tip] = sortedTips;
            sortedTips = unsortedTips;
        }
    }

    free(sortedPartials);
    free(sortedTips);

    kPatternsReordered = true;

    return BEAGLE_SUCCESS;
}